

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O2

void __thiscall QTextDocumentPrivate::finishEdit(QTextDocumentPrivate *this)

{
  int _t1;
  quint32 _t1_00;
  QTextDocument *this_00;
  Span *pSVar1;
  QTextCursorPrivate *d;
  bool bVar2;
  int in_ECX;
  ulong uVar3;
  int in_EDX;
  int in_ESI;
  QAbstractTextDocumentLayout *pQVar4;
  long lVar5;
  QTextCursor *cursor;
  QTextCursor *_t1_01;
  long in_FS_OFFSET;
  QTextCursor local_70;
  piter local_68;
  QArrayDataPointer<QTextCursor> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->editBlock == 0) {
    this_00 = *(QTextDocument **)&this->field_0x8;
    if (this->framesDirty == true) {
      scan_frames(this,in_ESI,in_EDX,in_ECX);
    }
    pQVar4 = this->lout;
    if ((pQVar4 != (QAbstractTextDocumentLayout *)0x0) && (_t1 = this->docChangeFrom, -1 < _t1)) {
      if (this->inContentsChange == false) {
        this->inContentsChange = true;
        QTextDocument::contentsChange(this_00,_t1,this->docChangeOldLength,this->docChangeLength);
        this->inContentsChange = false;
        pQVar4 = this->lout;
        _t1 = this->docChangeFrom;
      }
      (**(code **)(*(long *)pQVar4 + 0x90))
                (pQVar4,_t1,this->docChangeOldLength,this->docChangeLength);
    }
    this->docChangeFrom = -1;
    if ((this->field_0x294 & 1) != 0) {
      this->field_0x294 = this->field_0x294 & 0xfe;
      bVar2 = ensureMaximumBlockCount(this);
      if (bVar2) goto LAB_0045fd1e;
    }
    local_58.d = (Data *)0x0;
    local_58.ptr = (QTextCursor *)0x0;
    local_58.size = 0;
    local_68 = (piter)QHash<QTextCursorPrivate_*,_QHashDummyValue>::begin(&(this->cursors).q_hash);
    while( true ) {
      if (local_68.d == (Data<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_> *)0x0 &&
          local_68.bucket == 0) break;
      pSVar1 = (local_68.d)->spans;
      uVar3 = local_68.bucket >> 7;
      d = *(QTextCursorPrivate **)
           pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)local_68.bucket & 0x7f]].storage.data;
      if ((d->field_0x28 & 4) != 0) {
        d->field_0x28 = d->field_0x28 & 0xfb;
        QTextCursor::QTextCursor(&local_70,d);
        QList<QTextCursor>::emplaceBack<QTextCursor>((QList<QTextCursor> *)&local_58,&local_70);
        QTextCursor::~QTextCursor(&local_70);
      }
      QHashPrivate::iterator<QHashPrivate::Node<QTextCursorPrivate_*,_QHashDummyValue>_>::operator++
                (&local_68);
    }
    _t1_01 = local_58.ptr;
    for (lVar5 = local_58.size << 3; lVar5 != 0; lVar5 = lVar5 + -8) {
      QTextDocument::cursorPositionChanged(this_00,_t1_01);
      _t1_01 = _t1_01 + 1;
    }
    contentsChanged(this);
    _t1_00 = ((this->blocks).data.field_0.head)->node_count;
    if (_t1_00 != this->lastBlockCount) {
      this->lastBlockCount = _t1_00;
      QTextDocument::blockCountChanged(this_00,_t1_00);
    }
    if ((this->undoEnabled == false) && (this->unreachableCharacterCount != 0)) {
      compressPieceTable(this);
    }
    QArrayDataPointer<QTextCursor>::~QArrayDataPointer(&local_58);
  }
LAB_0045fd1e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::finishEdit()
{
    Q_Q(QTextDocument);

    if (editBlock)
        return;

    if (framesDirty)
        scan_frames(docChangeFrom, docChangeOldLength, docChangeLength);

    if (lout && docChangeFrom >= 0) {
        if (!inContentsChange) {
            QScopedValueRollback<bool> bg(inContentsChange, true);
            emit q->contentsChange(docChangeFrom, docChangeOldLength, docChangeLength);
        }
        lout->documentChanged(docChangeFrom, docChangeOldLength, docChangeLength);
    }

    docChangeFrom = -1;

    if (needsEnsureMaximumBlockCount) {
        needsEnsureMaximumBlockCount = false;
        if (ensureMaximumBlockCount()) {
            // if ensureMaximumBlockCount() returns true
            // it will have called endEditBlock() and
            // compressPieceTable() itself, so we return here
            // to prevent getting two contentsChanged emits
            return;
        }
    }

    QList<QTextCursor> changedCursors;
    for (QTextCursorPrivate *curs : std::as_const(cursors)) {
        if (curs->changed) {
            curs->changed = false;
            changedCursors.append(QTextCursor(curs));
        }
    }
    for (const QTextCursor &cursor : std::as_const(changedCursors))
        emit q->cursorPositionChanged(cursor);

    contentsChanged();

    if (blocks.numNodes() != lastBlockCount) {
        lastBlockCount = blocks.numNodes();
        emit q->blockCountChanged(lastBlockCount);
    }

    if (!undoEnabled && unreachableCharacterCount)
        compressPieceTable();
}